

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

_Bool upb_MapIterator_Done(upb_Map *map,size_t iter)

{
  _Bool _Var1;
  undefined1 local_28 [8];
  upb_strtable_iter i;
  size_t iter_local;
  upb_Map *map_local;
  
  i.index = iter;
  if (iter != 0xffffffffffffffff) {
    local_28 = (undefined1  [8])&map->table;
    i.t = (upb_strtable *)iter;
    _Var1 = upb_strtable_done((upb_strtable_iter *)local_28);
    return _Var1;
  }
  __assert_fail("iter != ((size_t) - 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/map.c"
                ,0x60,"_Bool upb_MapIterator_Done(const upb_Map *, size_t)");
}

Assistant:

bool upb_MapIterator_Done(const upb_Map* map, size_t iter) {
  upb_strtable_iter i;
  UPB_ASSERT(iter != kUpb_Map_Begin);
  i.t = &map->table;
  i.index = iter;
  return upb_strtable_done(&i);
}